

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcCodeStream::remove_fixup_at_ofs(CTcCodeStream *this,CTcCodeLabel *lbl,ulong ofs)

{
  CTcLabelFixup *pCVar1;
  CTcLabelFixup *nxt;
  CTcLabelFixup *prv;
  CTcLabelFixup *fixup;
  ulong ofs_local;
  CTcCodeLabel *lbl_local;
  CTcCodeStream *this_local;
  
  prv = (CTcLabelFixup *)0x0;
  fixup = lbl->fhead;
  while (fixup != (CTcLabelFixup *)0x0) {
    pCVar1 = fixup->nxt;
    if (fixup->ofs == ofs) {
      if (prv == (CTcLabelFixup *)0x0) {
        lbl->fhead = pCVar1;
      }
      else {
        prv->nxt = pCVar1;
      }
      fixup->nxt = this->free_fixup_;
      this->free_fixup_ = fixup;
    }
    prv = fixup;
    fixup = pCVar1;
  }
  return;
}

Assistant:

void CTcCodeStream::remove_fixup_at_ofs(CTcCodeLabel *lbl, ulong ofs)
{
    CTcLabelFixup *fixup;
    CTcLabelFixup *prv;
    CTcLabelFixup *nxt;

    /* scan for a match */
    for (prv = 0, fixup = lbl->fhead ; fixup != 0 ; prv = fixup, fixup = nxt)
    {
        /* remember the next one */
        nxt = fixup->nxt;
        
        /* if this is a match, remove it */
        if (fixup->ofs == ofs)
        {
            /* unlink this fixup from the list */
            if (prv == 0)
                lbl->fhead = nxt;
            else
                prv->nxt = nxt;

            /* move it to the free list */
            fixup->nxt = free_fixup_;
            free_fixup_ = fixup;
        }
    }
}